

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.c
# Opt level: O1

int getstring(int *ip,char *buffer,int size)

{
  ushort *puVar1;
  int iVar2;
  ushort **ppuVar3;
  uint uVar4;
  ulong uVar5;
  char cVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  
  ppuVar3 = __ctype_b_loc();
  puVar1 = *ppuVar3;
  uVar5 = (ulong)*ip;
  pcVar8 = prlnbuf + uVar5;
  cVar6 = prlnbuf[uVar5];
  while ((*(byte *)((long)puVar1 + (long)cVar6 * 2 + 1) & 0x20) != 0) {
    uVar4 = (int)uVar5 + 1;
    uVar5 = (ulong)uVar4;
    *ip = uVar4;
    cVar6 = pcVar8[1];
    pcVar8 = pcVar8 + 1;
  }
  *ip = (int)uVar5 + 1;
  if (*pcVar8 == '\"') {
    iVar2 = *ip;
    *ip = iVar2 + 1;
    cVar6 = prlnbuf[iVar2];
    uVar5 = 0;
    if (cVar6 != '\"') {
      uVar9 = (ulong)(uint)size;
      if (size < 1) {
        uVar9 = uVar5;
      }
      pcVar8 = "String too long!";
      do {
        if (uVar9 == uVar5) goto LAB_00109e8a;
        buffer[uVar5] = cVar6;
        uVar5 = uVar5 + 1;
        iVar2 = *ip;
        *ip = iVar2 + 1;
        cVar6 = prlnbuf[iVar2];
      } while (cVar6 != '\"');
    }
    buffer[uVar5] = '\0';
    puVar1 = *ppuVar3;
    iVar7 = *ip;
    iVar2 = 1;
    if ((*(byte *)((long)puVar1 + (long)prlnbuf[iVar7] * 2 + 1) & 0x20) != 0) {
      pcVar8 = prlnbuf + (long)iVar7 + 1;
      do {
        iVar7 = iVar7 + 1;
        *ip = iVar7;
        cVar6 = *pcVar8;
        pcVar8 = pcVar8 + 1;
      } while ((*(byte *)((long)puVar1 + (long)cVar6 * 2 + 1) & 0x20) != 0);
    }
  }
  else {
    pcVar8 = "Incorrect string syntax!";
LAB_00109e8a:
    error(pcVar8);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
getstring(int *ip, char *buffer, int size)
{
	char c;
	int i;

	/* skip spaces */
	while (isspace(prlnbuf[*ip]))
		(*ip)++;

	/* string must be enclosed */
	if (prlnbuf[(*ip)++] != '\"') {
		error("Incorrect string syntax!");
		return (0);
	}

	/* get string */
	i = 0;
	for (;;) {
		c = prlnbuf[(*ip)++];
		if (c == '\"')
			break;
		if (i >= size) {
			error("String too long!");
			return (0);
		}
		buffer[i++] = c;
	}

	/* end the string */
	buffer[i] = '\0';

	/* skip spaces */
	while (isspace(prlnbuf[*ip]))
		(*ip)++;

	/* ok */
	return (1);
}